

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O3

void __thiscall
ExecutionResult::ExecutionResult
          (ExecutionResult *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  TailContext *this_00;
  
  this->type = TAIL_CALL;
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (TailContext *)operator_new(0x28);
  TailContext::TailContext(this_00,func,args);
  (this->tail_context)._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>.
  _M_t.super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

ExecutionResult(const std::shared_ptr<SchemeProcedure> &func,
                    const std::list<std::shared_ptr<SchemeObject>> &args) :
        type(execution_result_t::TAIL_CALL), value(nullptr), tail_context(std::make_unique<TailContext>(func, args))
    {}